

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alp_compress.hpp
# Opt level: O0

void __thiscall
duckdb::AlpCompressionState<double>::Append
          (AlpCompressionState<double> *this,UnifiedVectorFormat *vdata,idx_t count)

{
  bool bVar1;
  unsigned_short uVar2;
  double *pdVar3;
  unsigned_long uVar4;
  idx_t iVar5;
  unsigned_long in_RDX;
  UnifiedVectorFormat *in_RSI;
  long in_RDI;
  bool is_null;
  double value_1;
  idx_t idx_1;
  idx_t i_1;
  double value;
  idx_t idx;
  idx_t i;
  unsigned_long values_to_fill_alp_input;
  idx_t offset_in_data;
  idx_t values_left_in_data;
  double *data;
  undefined7 in_stack_ffffffffffffff90;
  byte in_stack_ffffffffffffff97;
  TemplatedValidityMask<unsigned_long> *this_00;
  ulong local_58;
  AlpCompressionState<double> *in_stack_ffffffffffffffb0;
  ulong local_40;
  long local_30;
  unsigned_long local_28;
  
  pdVar3 = UnifiedVectorFormat::GetData<double>(in_RSI);
  local_30 = 0;
  local_28 = in_RDX;
  while (local_28 != 0) {
    uVar4 = MinValue<unsigned_long>(0x400 - *(long *)(in_RDI + 0x40),local_28);
    bVar1 = TemplatedValidityMask<unsigned_long>::AllValid
                      (&(in_RSI->validity).super_TemplatedValidityMask<unsigned_long>);
    if (bVar1) {
      for (local_40 = 0; local_40 < uVar4; local_40 = local_40 + 1) {
        iVar5 = SelectionVector::get_index(in_RSI->sel,local_30 + local_40);
        in_stack_ffffffffffffffb0 = (AlpCompressionState<double> *)pdVar3[iVar5];
        *(AlpCompressionState<double> **)(in_RDI + 0x78 + (*(long *)(in_RDI + 0x40) + local_40) * 8)
             = in_stack_ffffffffffffffb0;
      }
    }
    else {
      for (local_58 = 0; local_58 < uVar4; local_58 = local_58 + 1) {
        iVar5 = SelectionVector::get_index(in_RSI->sel,local_30 + local_58);
        this_00 = (TemplatedValidityMask<unsigned_long> *)pdVar3[iVar5];
        bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          (this_00,CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
        in_stack_ffffffffffffff97 = (bVar1 ^ 0xffU) & 1;
        uVar2 = UnsafeNumericCast<unsigned_short,unsigned_long,void>
                          (*(long *)(in_RDI + 0x40) + local_58);
        *(unsigned_short *)(in_RDI + 0x2078 + *(long *)(in_RDI + 0x48) * 2) = uVar2;
        *(ulong *)(in_RDI + 0x48) =
             (ulong)(in_stack_ffffffffffffff97 & 1) + *(long *)(in_RDI + 0x48);
        *(TemplatedValidityMask<unsigned_long> **)
         (in_RDI + 0x78 + (*(long *)(in_RDI + 0x40) + local_58) * 8) = this_00;
      }
    }
    local_30 = uVar4 + local_30;
    local_28 = local_28 - uVar4;
    *(unsigned_long *)(in_RDI + 0x40) = uVar4 + *(long *)(in_RDI + 0x40);
    if (*(long *)(in_RDI + 0x40) == 0x400) {
      CompressVector(in_stack_ffffffffffffffb0);
    }
  }
  return;
}

Assistant:

void Append(UnifiedVectorFormat &vdata, idx_t count) {
		auto data = UnifiedVectorFormat::GetData<T>(vdata);
		idx_t values_left_in_data = count;
		idx_t offset_in_data = 0;
		while (values_left_in_data > 0) {
			// We calculate until which value in data we must go to fill the input_vector
			// to avoid checking if input_vector is filled in each iteration
			auto values_to_fill_alp_input =
			    MinValue<idx_t>(AlpConstants::ALP_VECTOR_SIZE - vector_idx, values_left_in_data);
			if (vdata.validity.AllValid()) { //! We optimize a loop when there are no null
				for (idx_t i = 0; i < values_to_fill_alp_input; i++) {
					auto idx = vdata.sel->get_index(offset_in_data + i);
					T value = data[idx];
					input_vector[vector_idx + i] = value;
				}
			} else {
				for (idx_t i = 0; i < values_to_fill_alp_input; i++) {
					auto idx = vdata.sel->get_index(offset_in_data + i);
					T value = data[idx];
					bool is_null = !vdata.validity.RowIsValid(idx);
					//! We resolve null values with a predicated comparison
					vector_null_positions[nulls_idx] = UnsafeNumericCast<uint16_t>(vector_idx + i);
					nulls_idx += is_null;
					input_vector[vector_idx + i] = value;
				}
			}
			offset_in_data += values_to_fill_alp_input;
			values_left_in_data -= values_to_fill_alp_input;
			vector_idx += values_to_fill_alp_input;
			// We still need this check since we could have an incomplete input_vector at the end of data
			if (vector_idx == AlpConstants::ALP_VECTOR_SIZE) {
				CompressVector();
				D_ASSERT(vector_idx == 0);
			}
		}
	}